

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::FunctionalTest
          (FunctionalTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"functional",
             "Conditional Render Inverted Functional Test");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020d32f0;
  this->m_fbo_id = 0;
  this->m_rbo_id = 0;
  this->m_vao_id = 0;
  this->m_po_id = 0;
  this->m_qo_id = 0;
  return;
}

Assistant:

gl4cts::ConditionalRenderInverted::FunctionalTest::FunctionalTest(deqp::Context& context)
	: deqp::TestCase(context, "functional", "Conditional Render Inverted Functional Test")
	, m_fbo_id(0)
	, m_rbo_id(0)
	, m_vao_id(0)
	, m_po_id(0)
	, m_qo_id(0)
{
	/* Intentionally left blank. */
}